

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O0

void __thiscall
Rml::ElementBackgroundBorder::GenerateGeometry(ElementBackgroundBorder *this,Element *element)

{
  code *pcVar1;
  pointer this_00;
  int iVar2;
  pointer element_00;
  bool bVar3;
  Colour<unsigned_char,_255,_true> background_color_00;
  Colourb CVar4;
  int iVar5;
  RenderManager *mesh_00;
  ComputedValues *this_01;
  Type TVar6;
  Background *this_02;
  CallbackTexture *out_shadow_geometry;
  float opacity_00;
  CornerSizes border_radius_00;
  bool local_191;
  vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> local_178;
  CallbackTexture *local_160;
  CallbackTexture *shadow_texture;
  Geometry *shadow_geometry;
  Background *shadow_background;
  pointer pBStack_140;
  pointer local_138;
  undefined1 local_130 [8];
  BoxShadowList shadow_list;
  Property *p_box_shadow;
  Geometry *background_border_geometry;
  Colour<unsigned_char,_255,_true> local_f8;
  RenderBox local_f4;
  int local_b4;
  undefined1 local_b0 [4];
  int i;
  Mesh mesh;
  Geometry *geometry;
  CornerSizes border_radius;
  Colour<unsigned_char,_255,_true> local_58;
  Colour<unsigned_char,_255,_true> local_54;
  ColourbPremultiplied border_colors [4];
  bool local_3c;
  ColourbPremultiplied background_color;
  anon_class_8_2_2b02ffb6 ConvertColor;
  bool apply_opacity;
  float opacity;
  bool has_box_shadow;
  ComputedValues *computed;
  RenderManager *render_manager;
  Element *element_local;
  ElementBackgroundBorder *this_local;
  
  mesh_00 = Element::GetRenderManager(element);
  if (mesh_00 != (RenderManager *)0x0) {
    this_01 = Element::GetComputedValues(element);
    bVar3 = Style::ComputedValues::has_box_shadow(this_01);
    background_color = (ColourbPremultiplied)Style::ComputedValues::opacity(this_01);
    local_191 = !bVar3 && (float)background_color < 1.0;
    local_3c = local_191;
    border_colors[3] = (ColourbPremultiplied)Style::ComputedValues::background_color(this_01);
    background_color_00 =
         GenerateGeometry::anon_class_8_2_2b02ffb6::operator()
                   ((anon_class_8_2_2b02ffb6 *)&stack0xffffffffffffffc4,(Colourb)border_colors[3]);
    CVar4 = Style::ComputedValues::border_top_color(this_01);
    local_58 = GenerateGeometry::anon_class_8_2_2b02ffb6::operator()
                         ((anon_class_8_2_2b02ffb6 *)&stack0xffffffffffffffc4,CVar4);
    CVar4 = Style::ComputedValues::border_right_color(this_01);
    local_54 = GenerateGeometry::anon_class_8_2_2b02ffb6::operator()
                         ((anon_class_8_2_2b02ffb6 *)&stack0xffffffffffffffc4,CVar4);
    CVar4 = Style::ComputedValues::border_bottom_color(this_01);
    border_colors[0] =
         GenerateGeometry::anon_class_8_2_2b02ffb6::operator()
                   ((anon_class_8_2_2b02ffb6 *)&stack0xffffffffffffffc4,CVar4);
    CVar4 = Style::ComputedValues::border_left_color(this_01);
    border_colors[1] =
         GenerateGeometry::anon_class_8_2_2b02ffb6::operator()
                   ((anon_class_8_2_2b02ffb6 *)&stack0xffffffffffffffc4,CVar4);
    border_radius_00 = Style::ComputedValues::border_radius(this_01);
    mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)GetOrCreateBackground(this,BackgroundBorder);
    Geometry::Release((Mesh *)local_b0,
                      (Geometry *)
                      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,ClearMesh);
    for (local_b4 = 0; iVar2 = local_b4, iVar5 = Element::GetNumBoxes(element), iVar2 < iVar5;
        local_b4 = local_b4 + 1) {
      Element::GetRenderBox(&local_f4,element,Padding,local_b4);
      local_f8 = background_color_00;
      MeshUtilities::GenerateBackgroundBorder
                ((Mesh *)local_b0,&local_f4,background_color_00,&local_58);
    }
    RenderManager::MakeGeometry((RenderManager *)&background_border_geometry,(Mesh *)mesh_00);
    Geometry::operator=((Geometry *)
                        mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (Geometry *)&background_border_geometry);
    Geometry::~Geometry((Geometry *)&background_border_geometry);
    element_00 = mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    if (bVar3) {
      shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)Element::GetLocalProperty(element,BoxShadow);
      TVar6 = Variant::GetType((Variant *)
                               shadow_list.
                               super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((TVar6 != BOXSHADOWLIST) &&
         (bVar3 = Assert("RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementBackgroundBorder.cpp"
                         ,0xa3), !bVar3)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      this_00 = shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      shadow_background = (Background *)0x0;
      pBStack_140 = (pointer)0x0;
      local_138 = (pointer)0x0;
      ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::vector
                ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)&shadow_background);
      Variant::Get<std::vector<Rml::BoxShadow,std::allocator<Rml::BoxShadow>>>
                ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)local_130,
                 (Variant *)this_00,
                 (vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)&shadow_background);
      ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::~vector
                ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)&shadow_background);
      this_02 = GetOrCreateBackground(this,BoxShadow);
      out_shadow_geometry = &this_02->texture;
      local_160 = out_shadow_geometry;
      shadow_texture = (CallbackTexture *)this_02;
      shadow_geometry = &this_02->geometry;
      ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::vector
                (&local_178,(vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)local_130);
      opacity_00 = Style::ComputedValues::opacity(this_01);
      GeometryBoxShadow::Generate
                ((GeometryBoxShadow *)this_02,(Geometry *)out_shadow_geometry,
                 (CallbackTexture *)mesh_00,(RenderManager *)element,(Element *)element_00,
                 (Geometry *)&local_178,(BoxShadowList *)this_02,border_radius_00,opacity_00);
      ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::~vector(&local_178);
      ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::~vector
                ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)local_130);
    }
    Mesh::~Mesh((Mesh *)local_b0);
  }
  return;
}

Assistant:

void ElementBackgroundBorder::GenerateGeometry(Element* element)
{
	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return;

	const ComputedValues& computed = element->GetComputedValues();
	const bool has_box_shadow = computed.has_box_shadow();
	const float opacity = computed.opacity();

	// Apply opacity except if we have a box shadow. In the latter case the background is rendered opaquely into the box-shadow texture, while
	// opacity is applied to the entire box-shadow texture when that is rendered.
	bool apply_opacity = (!has_box_shadow && opacity < 1.f);

	auto ConvertColor = [=](Colourb color) {
		if (apply_opacity)
			return color.ToPremultiplied(opacity);
		else
			return color.ToPremultiplied();
	};

	ColourbPremultiplied background_color = ConvertColor(computed.background_color());
	ColourbPremultiplied border_colors[4] = {
		ConvertColor(computed.border_top_color()),
		ConvertColor(computed.border_right_color()),
		ConvertColor(computed.border_bottom_color()),
		ConvertColor(computed.border_left_color()),
	};
	const CornerSizes border_radius = computed.border_radius();

	Geometry& geometry = GetOrCreateBackground(BackgroundType::BackgroundBorder).geometry;
	Mesh mesh = geometry.Release(Geometry::ReleaseMode::ClearMesh);

	for (int i = 0; i < element->GetNumBoxes(); i++)
		MeshUtilities::GenerateBackgroundBorder(mesh, element->GetRenderBox(BoxArea::Padding, i), background_color, border_colors);

	geometry = render_manager->MakeGeometry(std::move(mesh));

	if (has_box_shadow)
	{
		Geometry& background_border_geometry = geometry;

		const Property* p_box_shadow = element->GetLocalProperty(PropertyId::BoxShadow);
		RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST);
		BoxShadowList shadow_list = p_box_shadow->value.Get<BoxShadowList>();

		// Generate the geometry for the box-shadow texture.
		Background& shadow_background = GetOrCreateBackground(BackgroundType::BoxShadow);
		Geometry& shadow_geometry = shadow_background.geometry;
		CallbackTexture& shadow_texture = shadow_background.texture;

		GeometryBoxShadow::Generate(shadow_geometry, shadow_texture, *render_manager, element, background_border_geometry, std::move(shadow_list),
			border_radius, computed.opacity());
	}
}